

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test3.cpp
# Opt level: O2

int main(void)

{
  initializer_list<P> __l;
  initializer_list<P> __l_00;
  initializer_list<P> __l_01;
  P local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  vector<P,_std::allocator<P>_> v1;
  vector<P,_std::allocator<P>_> v2;
  vector<P,_std::allocator<P>_> v3;
  
  local_a8.x = 1;
  local_a8.y = 0;
  __l._M_len = 1;
  __l._M_array = &local_a8;
  std::vector<P,_std::allocator<P>_>::vector
            ((vector<P,_std::allocator<P>_> *)local_60,__l,
             (allocator_type *)
             &v1.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  test_vector<P>((vector<P,_std::allocator<P>_> *)local_60);
  local_a8.x = 0;
  local_a8.y = 1;
  uStack_a0 = 0x300000002;
  local_98 = 0x500000004;
  __l_00._M_len = 3;
  __l_00._M_array = &local_a8;
  std::vector<P,_std::allocator<P>_>::vector
            ((vector<P,_std::allocator<P>_> *)
             &v1.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l_00,
             (allocator_type *)
             &v2.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  test_vector<P>((vector<P,_std::allocator<P>_> *)
                 &v1.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
  local_a8.x = 1;
  local_a8.y = 0;
  uStack_a0 = 0x100000002;
  local_98 = 0x200000003;
  uStack_90 = 0x300000004;
  local_88 = 0x400000005;
  uStack_80 = 0x500000006;
  local_78 = 0x600000007;
  uStack_70 = 0x700000008;
  local_68 = 0x800000009;
  __l_01._M_len = 9;
  __l_01._M_array = &local_a8;
  std::vector<P,_std::allocator<P>_>::vector
            ((vector<P,_std::allocator<P>_> *)
             &v2.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l_01,
             (allocator_type *)
             ((long)&v3.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage + 7));
  test_vector<P>((vector<P,_std::allocator<P>_> *)
                 &v2.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
  std::_Vector_base<P,_std::allocator<P>_>::~_Vector_base
            ((_Vector_base<P,_std::allocator<P>_> *)
             &v2.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<P,_std::allocator<P>_>::~_Vector_base
            ((_Vector_base<P,_std::allocator<P>_> *)
             &v1.super__Vector_base<P,_std::allocator<P>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<P,_std::allocator<P>_>::~_Vector_base
            ((_Vector_base<P,_std::allocator<P>_> *)local_60);
  return 0;
}

Assistant:

int main()
{
	// 1 element
	std::vector<P> v1 = { P(1,0) };
	test_vector(v1);

	// 3 elements
	std::vector<P> v2 = { P{0, 1}, P{2, 3}, P(4, 5)};
	test_vector(v2);

	// 9 elements
	std::vector<P> v3 = { P{1,0}, P{2,1}, P{3,2}
						, P{4,3}, P{5,4}, P{6,5}
						, P{7,6}, P{8,7}, P{9,8}
						};
	test_vector(v3);
}